

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinEPC18_1>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  undefined4 in_EAX;
  uint uVar1;
  undefined4 extraout_EAX;
  long lVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (0 < N) {
    lVar2 = 0;
    do {
      auVar7 = *(undefined1 (*) [16])((long)rho + lVar2 * 2);
      dVar4 = 0.0;
      if (1e-24 < auVar7._8_8_ + auVar7._0_8_) {
        auVar7 = maxpd(_DAT_01040f80,auVar7);
        dVar8 = auVar7._8_8_;
        dVar4 = auVar7._0_8_;
        dVar10 = dVar4 + dVar8;
        dVar9 = 1.0 / dVar10;
        dVar11 = (dVar4 - dVar8) * dVar9;
        auVar7._8_8_ = -(ulong)(dVar9 * (dVar8 + dVar8) <= 1e-15);
        auVar7._0_8_ = -(ulong)(dVar9 * (dVar4 + dVar4) <= 1e-15);
        uVar1 = movmskpd(in_EAX,auVar7);
        dVar9 = 1.9999999999999991;
        if ((uVar1 & 2) == 0) {
          dVar9 = dVar11 + 1.0;
        }
        bVar3 = (uVar1 & 1) == 0;
        dVar5 = 9.992007221626409e-16;
        if (bVar3) {
          dVar5 = dVar9;
        }
        dVar9 = 1.9999999999999991;
        if (bVar3) {
          dVar9 = 1.0 - dVar11;
        }
        dVar11 = 9.992007221626409e-16;
        if ((uVar1 & 2) == 0) {
          dVar11 = dVar9;
        }
        dVar9 = cbrt(dVar5 * dVar10);
        dVar6 = cbrt(dVar10 * dVar11);
        dVar9 = dVar6 * 1.5874010519681996 * 0.5 + dVar9 * 1.5874010519681996 * 0.5;
        dVar6 = dVar9 * dVar9;
        dVar9 = (1.0 / (dVar6 * dVar6 * 0.03 * dVar6 + dVar9 * dVar6 * -0.1 + 1.8)) * dVar11 *
                dVar5 * dVar10 * -0.25;
        dVar4 = (double)(~-(ulong)(dVar8 <= 1e-24) & (ulong)dVar9 & -(ulong)(dVar4 <= 1e-24) |
                        ~-(ulong)(dVar4 <= 1e-24) & (ulong)dVar9);
        in_EAX = extraout_EAX;
      }
      *(double *)((long)eps + lVar2) = dVar4 * scal_fact + *(double *)((long)eps + lVar2);
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)N << 3 != lVar2);
  }
  return;
}

Assistant:

LDA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;

    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], e );
    
    eps[i] += scal_fact * e;

  }

}